

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

unique_ptr<Catch::MultiReporter> __thiscall
Catch::Detail::make_unique<Catch::MultiReporter,Catch::Config_const*&>(Detail *this,Config **args)

{
  Config *pCVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)operator_new(0x40);
  pCVar1 = *args;
  *(undefined2 *)(puVar2 + 1) = 0;
  puVar2[2] = pCVar1;
  *puVar2 = &PTR__MultiReporter_001a6380;
  puVar2[7] = 0;
  *(undefined8 *)((long)puVar2 + 0x21) = 0;
  *(undefined8 *)((long)puVar2 + 0x29) = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  *(undefined8 **)this = puVar2;
  return (unique_ptr<Catch::MultiReporter>)(MultiReporter *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }